

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O1

void Sbc_ManDelayTrace(Gia_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  void *__s;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int *pLevels;
  uint local_6c;
  int *local_68;
  Gia_Man_t *local_60;
  ulong local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  Vec_Int_t *local_40;
  ulong local_38;
  
  iVar15 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar15 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar15 * 4);
  }
  memset(__s,0,(long)iVar15 << 2);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    puts("No mapping is available.");
    return;
  }
  iVar15 = iVar15 * 0x20;
  uVar6 = Gia_ManLutLevel(p,&local_68);
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    piVar4 = pVVar3->pArray;
    lVar12 = 0;
    do {
      iVar2 = piVar4[lVar12];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = iVar2 - (*(uint *)(p->pObjs + iVar2) & 0x1fffffff);
      if (local_68[(int)uVar7] == uVar6) {
        if (((int)uVar7 < 0) || (iVar15 <= (int)uVar7)) {
LAB_00545ff5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s + (ulong)(uVar7 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar7 & 0x1f);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar3->nSize);
  }
  iVar2 = p->nObjs;
  local_58 = (ulong)iVar2;
  iVar11 = 0;
  uVar7 = 0;
  local_6c = 0;
  uVar16 = 0;
  local_60 = p;
  local_48 = uVar6;
  if (1 < (long)local_58) {
    pVVar3 = p->vMapping;
    uVar16 = 0;
    local_6c = 0;
    uVar7 = 0;
    uVar9 = local_58;
    do {
      if ((long)pVVar3->nSize < (long)uVar9) goto LAB_00545fb7;
      uVar14 = uVar9 - 1;
      piVar4 = pVVar3->pArray;
      if (piVar4[uVar14] != 0) {
        if ((long)iVar15 < (long)uVar9) {
LAB_00545fd6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar7 = uVar7 + 1;
        if ((*(uint *)((long)__s + (uVar14 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar14 & 0x1f) & 1) != 0
           ) {
          lVar12 = (long)pVVar3->nSize;
          if (lVar12 < (long)uVar9) goto LAB_00545fb7;
          local_6c = local_6c + 1;
          lVar13 = 0;
          while( true ) {
            lVar8 = (long)piVar4[uVar14];
            if ((lVar8 < 0) || ((int)lVar12 <= piVar4[uVar14])) goto LAB_00545fb7;
            if (piVar4[lVar8] <= lVar13) break;
            uVar6 = piVar4[lVar8 + lVar13 + 1];
            if (local_68[uVar14] <= local_68[(int)uVar6] + 1) {
              if (local_68[(int)uVar6] + 1 != local_68[uVar14]) {
                __assert_fail("pLevels[iFan] + 1 == pLevels[i]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                              ,0xaf,"void Sbc_ManDelayTrace(Gia_Man_t *)");
              }
              if (((int)uVar6 < 0) || (iVar15 <= (int)uVar6)) goto LAB_00545ff5;
              puVar1 = (uint *)((long)__s + (ulong)(uVar6 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
              uVar16 = uVar16 + 1;
            }
            lVar13 = lVar13 + 1;
            lVar12 = (long)pVVar3->nSize;
            if (lVar12 < (long)uVar9) goto LAB_00545fb7;
          }
        }
      }
      bVar5 = 2 < (long)uVar9;
      uVar9 = uVar14;
    } while (bVar5);
  }
  local_4c = uVar7;
  if (1 < iVar2) {
    local_40 = p->vMapping;
    local_44 = local_40->nSize;
    local_38 = 1;
    if (1 < (int)local_44) {
      local_38 = (ulong)local_44;
    }
    uVar9 = 1;
    iVar11 = 0;
    do {
      if (uVar9 == local_38) {
LAB_00545fb7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = local_40->pArray[uVar9];
      if ((ulong)uVar6 != 0) {
        if ((int)local_44 <= (int)uVar6 || (int)uVar6 < 0) goto LAB_00545fb7;
        puVar1 = (uint *)(local_40->pArray + uVar6);
        uVar7 = *puVar1;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar14 = 0;
        while (uVar7 != uVar14) {
          if ((long)iVar15 <= (long)uVar9) goto LAB_00545fd6;
          if ((*(uint *)((long)__s + (uVar9 >> 5 & 0x7ffffff) * 4) & 1 << ((byte)uVar9 & 0x1f)) == 0
             ) {
            uVar10 = 0;
          }
          else {
            uVar10 = puVar1[uVar14 + 1];
            if (((int)uVar10 < 0) || (iVar15 <= (int)uVar10)) goto LAB_00545fd6;
            uVar10 = (uint)((*(uint *)((long)__s + (ulong)(uVar10 >> 5) * 4) >> (uVar10 & 0x1f) & 1)
                           != 0);
          }
          iVar11 = iVar11 + uVar10;
          uVar14 = uVar14 + 1;
          if ((int)local_44 <= (int)uVar6 || (int)uVar6 < 0) goto LAB_00545fb7;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_58);
  }
  if (local_68 != (int *)0x0) {
    free(local_68);
    local_68 = (int *)0x0;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n",
         (ulong)(uint)(~(local_60->vCos->nSize + local_60->vCis->nSize) + local_60->nObjs),
         (ulong)local_4c,(ulong)local_48,(ulong)local_6c,(ulong)uVar16,iVar11);
  return;
}

Assistant:

void Sbc_ManDelayTrace( Gia_Man_t * p )
{
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, iFan, nLevels, * pLevels;
    int nLuts = 0, nNodes = 0, nEdges = 0, nEdgesAll = 0;
    if ( !Gia_ManHasMapping(p) )
    {
        printf( "No mapping is available.\n" );
        return;
    }
    assert( Gia_ManHasMapping(p) );
    // set critical CO drivers
    nLevels = Gia_ManLutLevel( p, &pLevels );
    Gia_ManForEachCoDriverId( p, iFan, i )
        if ( pLevels[iFan] == nLevels )
            Vec_BitWriteEntry( vPath, iFan, 1 );
    // set critical internal nodes
    Gia_ManForEachLutReverse( p, i )
    { 
        nLuts++;
        if ( !Vec_BitEntry(vPath, i) )
            continue;
        nNodes++;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            if ( pLevels[iFan] +1 < pLevels[i] )
                continue;
            assert( pLevels[iFan] + 1 == pLevels[i] );
            Vec_BitWriteEntry( vPath, iFan, 1 );
            nEdges++;
            //printf( "%d -> %d\n", i, iFan );
        }
    }
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            nEdgesAll += (Vec_BitEntry(vPath, i) && Vec_BitEntry(vPath, iFan));

    ABC_FREE( pLevels );
    Vec_BitFree( vPath );
    printf( "AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n", 
        Gia_ManAndNum(p), nLuts, nLevels, nNodes, nEdges, nEdgesAll );
}